

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O1

void __thiscall
t_swift_generator::generate_old_swift_struct_writer
          (t_swift_generator *this,ostream *out,t_struct *tstruct,bool is_private)

{
  long lVar1;
  t_field *tfield;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000009;
  pointer pptVar5;
  char *pcVar6;
  string visibility;
  string name;
  char *local_b0;
  long local_a8;
  char local_a0 [16];
  string local_90;
  string local_70;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  pcVar6 = "public";
  if ((int)CONCAT71(in_register_00000009,is_private) != 0) {
    pcVar6 = "private";
  }
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,pcVar6,
             pcVar6 + (CONCAT71(in_register_00000009,is_private) & 0xffffffff) + 6);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_b0,local_a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4," static func writeValue(__value: ",0x21);
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,*(char **)CONCAT44(extraout_var,iVar3),
                      ((undefined8 *)CONCAT44(extraout_var,iVar3))[1]);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,", toProtocol __proto: TProtocol) throws",0x27);
  block_open(this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  local_50 = local_40;
  lVar1 = *(long *)CONCAT44(extraout_var_00,iVar3);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,lVar1,((long *)CONCAT44(extraout_var_00,iVar3))[1] + lVar1);
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"try __proto.writeStructBeginWithName(\"",0x26);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\")",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  for (pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar5 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
    tfield = *pptVar5;
    bVar2 = field_is_optional(this,tfield);
    if (bVar2) {
      poVar4 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"if let ",7);
      maybe_escape_identifier(&local_70,this,&tfield->name_);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = __value.",0xb);
      maybe_escape_identifier(&local_90,this,&tfield->name_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,local_90._M_dataplus._M_p,local_90._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      block_open(this,out);
    }
    poVar4 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"try __proto.writeFieldValue(",0x1c);
    pcVar6 = "__value.";
    if (bVar2) {
      pcVar6 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,(ulong)!bVar2 << 3);
    maybe_escape_identifier(&local_70,this,&tfield->name_);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"name: \"",7);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(tfield->name_)._M_dataplus._M_p,(tfield->name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\", ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"type: ",6);
    type_to_enum_abi_cxx11_(&local_90,this,tfield->type_,false);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"id: ",4);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,tfield->key_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (bVar2) {
      block_close(this,out,true);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"try __proto.writeFieldStop()",0x1c);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"try __proto.writeStructEnd()",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  block_close(this,out,true);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  return;
}

Assistant:

void t_swift_generator::generate_old_swift_struct_writer(ostream& out,
                                                         t_struct* tstruct,
                                                         bool is_private) {

  string visibility = is_private ? "private" : "public";

  indent(out) << visibility << " static func writeValue(__value: " << tstruct->get_name()
              << ", toProtocol __proto: TProtocol) throws";
  block_open(out);
  out << endl;

  string name = tstruct->get_name();
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  indent(out) << "try __proto.writeStructBeginWithName(\"" << name << "\")" << endl;
  out << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field *tfield = *f_iter;

    bool optional = field_is_optional(tfield);
    if (optional) {
      indent(out) << "if let " << maybe_escape_identifier(tfield->get_name())
                  << " = __value." << maybe_escape_identifier(tfield->get_name());
      block_open(out);
    }

    indent(out) << "try __proto.writeFieldValue("
                << (optional ? "" : "__value.") << maybe_escape_identifier(tfield->get_name()) << ", "
                << "name: \"" << tfield->get_name() << "\", "
                << "type: " << type_to_enum(tfield->get_type()) << ", "
                << "id: " << tfield->get_key() << ")" << endl;

    if (optional) {
      block_close(out);
    }

    out << endl;
  }

  indent(out) << "try __proto.writeFieldStop()" << endl << endl;
  indent(out) << "try __proto.writeStructEnd()" << endl;
  block_close(out);
  out << endl;
}